

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * jsonBadPathError(sqlite3_context *ctx,char *zPath)

{
  undefined8 in_RSI;
  long in_RDI;
  char *zMsg;
  char *in_stack_ffffffffffffffd8;
  sqlite3_context *local_8;
  
  local_8 = (sqlite3_context *)sqlite3_mprintf("bad JSON path: %Q",in_RSI);
  if (in_RDI != 0) {
    if (local_8 == (sqlite3_context *)0x0) {
      sqlite3_result_error_nomem((sqlite3_context *)0x23205c);
    }
    else {
      sqlite3_result_error(local_8,in_stack_ffffffffffffffd8,0);
      sqlite3_free((void *)0x232050);
    }
    local_8 = (sqlite3_context *)0x0;
  }
  return (char *)local_8;
}

Assistant:

static char *jsonBadPathError(
  sqlite3_context *ctx,     /* The function call containing the error */
  const char *zPath         /* The path with the problem */
){
  char *zMsg = sqlite3_mprintf("bad JSON path: %Q", zPath);
  if( ctx==0 ) return zMsg;
  if( zMsg ){
    sqlite3_result_error(ctx, zMsg, -1);
    sqlite3_free(zMsg);
  }else{
    sqlite3_result_error_nomem(ctx);
  }
  return 0;
}